

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O3

uint * Gia_ManConvertAigToTruth
                 (Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vTruth,
                 Vec_Int_t *vVisited)

{
  undefined4 uVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  void *pvVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  int *piVar12;
  Gia_Obj_t *pGVar13;
  uint *puVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 extraout_RDX;
  undefined8 uVar18;
  undefined8 extraout_RDX_00;
  uint uVar19;
  uint (*pauVar20) [8];
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint nWords;
  int iVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  
  iVar24 = vLeaves->nSize;
  uVar23 = (ulong)iVar24;
  iVar15 = iVar24 + -5;
  uVar19 = 1 << ((byte)iVar15 & 0x1f);
  nWords = 1;
  if (5 < (long)uVar23) {
    nWords = uVar19;
  }
  if ((~*(ulong *)((ulong)pRoot & 0xfffffffffffffffe) & 0x1fffffff1fffffff) == 0) {
    vTruth->nSize = 0;
    if (0 < (int)nWords) {
      vTruth->nSize = nWords;
      if (vTruth->nCap < (int)nWords) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = vTruth->pArray;
      }
      if (((ulong)pRoot & 1) == 0) {
        iVar24 = 0;
      }
      else {
        iVar24 = 0xff;
      }
      puVar14 = (uint *)memset(piVar10,iVar24,(ulong)nWords << 2);
      return puVar14;
    }
LAB_007146e5:
    __assert_fail("nWords > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
  }
  if (iVar24 < 9) {
    piVar10 = (int *)0x0;
  }
  else {
    pvVar8 = malloc(((long)(int)uVar19 * 4 + 8) * uVar23);
    lVar9 = uVar23 * 8;
    uVar16 = 0;
    do {
      *(long *)((long)pvVar8 + uVar16 * 8) = (long)pvVar8 + lVar9;
      uVar16 = uVar16 + 1;
      lVar9 = lVar9 + (long)(int)uVar19 * 4;
    } while (uVar23 != uVar16);
    piVar10 = (int *)malloc(0x10);
    piVar10[1] = iVar24;
    *piVar10 = iVar24;
    *(void **)(piVar10 + 2) = pvVar8;
    auVar7 = _DAT_0094f530;
    auVar6 = _DAT_0094e250;
    auVar5 = _DAT_0094e240;
    if ((int)uVar19 < 2) {
      uVar19 = 1;
    }
    lVar9 = (ulong)uVar19 - 1;
    auVar25._8_4_ = (int)lVar9;
    auVar25._0_8_ = lVar9;
    auVar25._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar16 = 0;
    auVar25 = auVar25 ^ _DAT_0094e250;
    do {
      lVar9 = *(long *)((long)pvVar8 + uVar16 * 8);
      iVar24 = auVar25._0_4_;
      iVar26 = auVar25._4_4_;
      if (uVar16 < 5) {
        if (iVar15 != 0x1f) {
          uVar1 = (&DAT_00a41eb0)[uVar16];
          lVar22 = 0;
          auVar27 = auVar5;
          auVar28 = auVar7;
          do {
            auVar29 = auVar27 ^ auVar6;
            if ((bool)(~(auVar29._4_4_ == iVar26 && iVar24 < auVar29._0_4_ || iVar26 < auVar29._4_4_
                        ) & 1)) {
              *(undefined4 *)(lVar9 + lVar22) = uVar1;
            }
            if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
                auVar29._12_4_ <= auVar25._12_4_) {
              *(undefined4 *)(lVar9 + 4 + lVar22) = uVar1;
            }
            iVar30 = SUB164(auVar28 ^ auVar6,4);
            if (iVar30 <= iVar26 && (iVar30 != iVar26 || SUB164(auVar28 ^ auVar6,0) <= iVar24)) {
              *(undefined4 *)(lVar9 + 8 + lVar22) = uVar1;
              *(undefined4 *)(lVar9 + 0xc + lVar22) = uVar1;
            }
            lVar11 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar11 + 4;
            lVar11 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar11 + 4;
            lVar22 = lVar22 + 0x10;
          } while ((ulong)(uVar19 + 3 & 0xfffffffc) << 2 != lVar22);
        }
      }
      else if (iVar15 != 0x1f) {
        uVar21 = 1 << ((char)uVar16 - 5U & 0x1f);
        uVar17 = 0;
        auVar29 = auVar5;
        do {
          bVar4 = iVar24 < SUB164(auVar29 ^ auVar6,0);
          iVar30 = SUB164(auVar29 ^ auVar6,4);
          if ((bool)(~(iVar26 < iVar30 || iVar30 == iVar26 && bVar4) & 1)) {
            *(uint *)(lVar9 + uVar17 * 4) = -(uint)((uVar21 & (uint)uVar17) != 0);
          }
          if (iVar26 >= iVar30 && (iVar30 != iVar26 || !bVar4)) {
            *(uint *)(lVar9 + 4 + uVar17 * 4) = -(uint)(((uint)uVar17 + 1 & uVar21) != 0);
          }
          uVar17 = uVar17 + 2;
          lVar22 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 2;
          auVar29._8_8_ = lVar22 + 2;
        } while ((uVar19 + 1 & 0xfffffffe) != uVar17);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar23);
  }
  vTruth->nSize = 0;
  vVisited->nSize = 0;
  uVar23 = (ulong)nWords;
  if (0 < vLeaves->nSize) {
    pauVar20 = Gia_ManConvertAigToTruth::uTruths;
    lVar9 = 0;
    do {
      iVar24 = vLeaves->pArray[lVar9];
      lVar22 = (long)iVar24;
      if ((lVar22 < 0) || (p->nObjs <= iVar24)) goto LAB_00714688;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      if ((int)nWords < 1) goto LAB_007146e5;
      lVar11 = (long)vTruth->nSize + (long)(int)nWords;
      iVar15 = (int)lVar11;
      vTruth->nSize = iVar15;
      if (vTruth->nCap < iVar15) {
        piVar12 = (int *)0x0;
      }
      else {
        piVar12 = vTruth->pArray + (lVar11 - uVar23);
      }
      uVar16 = uVar23 + 1;
      if (piVar10 == (int *)0x0) {
        do {
          uVar17 = (ulong)pauVar20[-1][uVar16 + 6];
          piVar12[uVar16 - 2] = pauVar20[-1][uVar16 + 6];
          uVar16 = uVar16 - 1;
        } while (1 < uVar16);
      }
      else {
        if (piVar10[1] <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar11 = *(long *)(*(long *)(piVar10 + 2) + lVar9 * 8);
        uVar17 = uVar23 + 1;
        do {
          piVar12[uVar17 - 2] = *(int *)(lVar11 + -8 + uVar17 * 4);
          uVar17 = uVar17 - 1;
        } while (1 < uVar17);
      }
      if (p->nObjs <= iVar24) {
LAB_007146a7:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pVVar2 = p->vTruths;
      iVar15 = vVisited->nSize;
      Vec_IntFillExtra(pVVar2,iVar24 + 1,(int)uVar17);
      if (pVVar2->nSize <= iVar24) goto LAB_007146c6;
      pGVar13 = pGVar13 + lVar22;
      pVVar2->pArray[lVar22] = iVar15;
      pGVar3 = p->pObjs;
      if ((pGVar13 < pGVar3) || (pGVar3 + p->nObjs <= pGVar13)) goto LAB_007146a7;
      Vec_IntPush(vVisited,(int)((ulong)((long)pGVar13 - (long)pGVar3) >> 2) * -0x55555555);
      lVar9 = lVar9 + 1;
      pauVar20 = pauVar20 + 1;
    } while (lVar9 < vLeaves->nSize);
  }
  if (piVar10 != (int *)0x0) {
    if (*(void **)(piVar10 + 2) != (void *)0x0) {
      free(*(void **)(piVar10 + 2));
    }
    free(piVar10);
  }
  puVar14 = Gia_ManConvertAigToTruth_rec
                      (p,(Gia_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe),vTruth,nWords,vVisited);
  if ((0 < (int)nWords & (byte)pRoot) == 1) {
    uVar23 = uVar23 + 1;
    do {
      puVar14[uVar23 - 2] = ~puVar14[uVar23 - 2];
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
  }
  if (0 < vVisited->nSize) {
    lVar9 = 0;
    uVar18 = extraout_RDX;
    do {
      iVar24 = vVisited->pArray[lVar9];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) {
LAB_00714688:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return puVar14;
      }
      pVVar2 = p->vTruths;
      Vec_IntFillExtra(pVVar2,iVar24 + 1,(int)uVar18);
      if (pVVar2->nSize <= iVar24) {
LAB_007146c6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar2->pArray[iVar24] = -1;
      lVar9 = lVar9 + 1;
      uVar18 = extraout_RDX_00;
    } while (lVar9 < vVisited->nSize);
  }
  return puVar14;
}

Assistant:

unsigned * Gia_ManConvertAigToTruth( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vTruth, Vec_Int_t * vVisited )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Gia_Obj_t * pObj;
    Vec_Ptr_t * vTtElems = NULL;
    unsigned * pTruth;//, * pTruth2;
    int i, nWords, nVars;
    // get the number of variables and words
    nVars  = Vec_IntSize( vLeaves );
    nWords = Abc_TruthWordNum( nVars );
    // check the case of a constant
    if ( Gia_ObjIsConst0( Gia_Regular(pRoot) ) )
    {
        Vec_IntClear( vTruth );
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        if ( !Gia_IsComplement(pRoot) )
            Gia_ManTruthClear( pTruth, nVars );
        else
            Gia_ManTruthFill( pTruth, nVars );
        return pTruth;
    }
    // if the number of variables is more than 8, allocate truth tables
    if ( nVars > 8 )
        vTtElems = Vec_PtrAllocTruthTables( nVars );
    // assign elementary truth tables
    Vec_IntClear( vTruth );
    Vec_IntClear( vVisited );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        // assign elementary variable
        if ( vTtElems )
            Gia_ManTruthCopy( pTruth, (unsigned *)Vec_PtrEntry(vTtElems, i), nVars );
        else
            Gia_ManTruthCopy( pTruth, uTruths[i], nVars );
        // save the visited node
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), Vec_IntSize(vVisited) );
        Vec_IntPush( vVisited, Gia_ObjId(p, pObj) );
    }
    if ( vTtElems )
        Vec_PtrFree( vTtElems );
    // clear the marks and compute the truth table
//    pTruth2 = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    pTruth = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    // copy the result
//    Gia_ManTruthCopy( pTruth, pTruth2, nVars );
    if ( Gia_IsComplement(pRoot) )
        Gia_ManTruthNot( pTruth, pTruth, nVars );
    // clean truth tables
    Gia_ManForEachObjVec( vVisited, p, pObj, i )
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), -1 );
    return pTruth;
}